

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Polygon * __thiscall nite::Polygon::operator-(Polygon *__return_storage_ptr__,Polygon *this,float c)

{
  size_type sVar1;
  reference pvVar2;
  int local_24;
  int i;
  float c_local;
  Polygon *this_local;
  Polygon *sub;
  
  Polygon(__return_storage_ptr__,this);
  for (local_24 = 0;
      sVar1 = std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::size
                        (&__return_storage_ptr__->vert), (ulong)(long)local_24 < sVar1;
      local_24 = local_24 + 1) {
    pvVar2 = std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::operator[]
                       (&__return_storage_ptr__->vert,(long)local_24);
    pvVar2->x = pvVar2->x - c;
    pvVar2 = std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::operator[]
                       (&__return_storage_ptr__->vert,(long)local_24);
    pvVar2->y = pvVar2->y - c;
  }
  return __return_storage_ptr__;
}

Assistant:

nite::Polygon nite::Polygon::operator-(float c){
	auto sub = *this;
	for(int i = 0; i < sub.vert.size(); ++i){
		sub.vert[i].x -= c;
		sub.vert[i].y -= c;
	}
	return sub;
}